

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall wallet::anon_unknown_5::WalletLoaderImpl::registerRpcs(WalletLoaderImpl *this)

{
  size_t *psVar1;
  Chain *pCVar2;
  string category;
  string name;
  Actor actor;
  pointer p_Var3;
  iterator __tmp;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  CRPCCommand *__str;
  long lVar5;
  long in_FS_OFFSET;
  Span<const_CRPCCommand> SVar6;
  vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
  *this_00;
  allocator<std::_List_node<CRPCCommand>_> *paVar7;
  _Alloc_hider _Var8;
  _Vector_impl_data in_stack_ffffffffffffff50;
  undefined8 uVar9;
  undefined8 uVar10;
  code *pcVar11;
  code *pcVar12;
  _Vector_impl_data in_stack_ffffffffffffff88;
  long *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SVar6 = GetWalletRPCCommands();
  this_00 = (vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
             *)&this->m_rpc_handlers;
  lVar5 = SVar6.m_size << 7;
  while( true ) {
    __str = SVar6.m_data;
    if (lVar5 == 0) break;
    p_Var3 = _GLOBAL__N_1::std::__cxx11::_List_base<CRPCCommand,_std::allocator<CRPCCommand>_>::
             _M_get_node(&(this->m_rpc_commands).
                          super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>);
    paVar7 = (allocator<std::_List_node<CRPCCommand>_> *)&this->m_rpc_commands;
    _Var8._M_p = (pointer)p_Var3;
    std::__cxx11::string::string
              ((string *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__str->name);
    pcVar12 = _GLOBAL__N_1::std::
              _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp:581:73)>
              ::_M_invoke;
    pcVar11 = _GLOBAL__N_1::std::
              _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp:581:73)>
              ::_M_manager;
    uVar9 = this;
    uVar10 = __str;
    _GLOBAL__N_1::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)&stack0xffffffffffffff50,&__str->argNames);
    category._M_string_length = (size_type)__str;
    category._M_dataplus._M_p = (pointer)this_00;
    category.field_2._M_allocated_capacity = lVar5;
    category.field_2._8_8_ = paVar7;
    name._8_24_ = in_stack_ffffffffffffff50;
    name._M_dataplus._M_p = _Var8._M_p;
    actor.super__Function_base._M_functor._8_8_ = uVar10;
    actor.super__Function_base._M_functor._M_unused._M_object = (void *)uVar9;
    actor.super__Function_base._M_manager = pcVar11;
    actor._M_invoker = pcVar12;
    CRPCCommand::CRPCCommand
              ((CRPCCommand *)&p_Var3->_M_storage,category,name,actor,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                )in_stack_ffffffffffffff88,(intptr_t)local_58);
    _GLOBAL__N_1::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&stack0xffffffffffffff50);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string((string *)local_58);
    _GLOBAL__N_1::std::__allocated_ptr<std::allocator<std::_List_node<CRPCCommand>_>_>::
    ~__allocated_ptr((__allocated_ptr<std::allocator<std::_List_node<CRPCCommand>_>_> *)
                     &stack0xffffffffffffff40);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->m_rpc_commands).super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pCVar2 = (this->m_context).chain;
    (**(code **)(*(long *)pCVar2 + 0x158))
              ((string *)local_58,pCVar2,
               (this->m_rpc_commands).super__List_base<CRPCCommand,_std::allocator<CRPCCommand>_>.
               _M_impl._M_node.super__List_node_base._M_prev + 1);
    std::
    vector<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>,std::allocator<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>>
    ::emplace_back<std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>>
              (this_00,(unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *
                       )local_58);
    sVar4 = extraout_RDX;
    if (local_58[0] != (long *)0x0) {
      (**(code **)(*local_58[0] + 8))();
      sVar4 = extraout_RDX_00;
    }
    SVar6.m_size = sVar4;
    SVar6.m_data = __str + 1;
    lVar5 = lVar5 + -0x80;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void registerRpcs() override
    {
        for (const CRPCCommand& command : GetWalletRPCCommands()) {
            m_rpc_commands.emplace_back(command.category, command.name, [this, &command](const JSONRPCRequest& request, UniValue& result, bool last_handler) {
                JSONRPCRequest wallet_request = request;
                wallet_request.context = &m_context;
                return command.actor(wallet_request, result, last_handler);
            }, command.argNames, command.unique_id);
            m_rpc_handlers.emplace_back(m_context.chain->handleRpc(m_rpc_commands.back()));
        }
    }